

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O0

Vec_Int_t * Gia_ManGroupProve(Gia_Man_t *pInit,char *pCommLine,int nGroupSize,int fVerbose)

{
  Vec_Ptr_t *pVVar1;
  Gia_Man_t *p_00;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  abctime aVar7;
  int *piVar8;
  abctime aVar9;
  abctime aVar10;
  Abc_Cex_t *Entry;
  Vec_Int_t *p_01;
  Vec_Ptr_t *pVVar11;
  void *local_c8;
  uint local_94;
  Vec_Ptr_t *vCexesCur;
  Vec_Int_t *vStatusCur;
  abctime timeStart;
  abctime timeComm;
  abctime clk;
  int nGroups;
  int nGroupCur;
  int k;
  int i;
  Vec_Ptr_t *vCexes;
  Vec_Int_t *vOutMap;
  Vec_Int_t *vOuts;
  Gia_Man_t *pGroup;
  Gia_Man_t *p;
  Abc_Frame_t *pAbc;
  int fVerbose_local;
  int nGroupSize_local;
  char *pCommLine_local;
  Gia_Man_t *pInit_local;
  
  pAbc._0_4_ = fVerbose;
  pAbc._4_4_ = nGroupSize;
  _fVerbose_local = pCommLine;
  pCommLine_local = (char *)pInit;
  p = (Gia_Man_t *)Abc_FrameReadGlobalFrame();
  pGroup = Gia_ManDup((Gia_Man_t *)pCommLine_local);
  timeStart = 0;
  aVar7 = Abc_Clock();
  if ((int)pAbc._4_4_ < 1) {
    __assert_fail("nGroupSize > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x734,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (_fVerbose_local == (char *)0x0) {
    __assert_fail("pCommLine != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x735,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (pGroup->nConstrs != 0) {
    __assert_fail("p->nConstrs == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                  ,0x736,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  Abc_Print(1,"RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n",(ulong)pAbc._4_4_,
            _fVerbose_local);
  iVar2 = Gia_ManPoNum(pGroup);
  vOutMap = Vec_IntStartNatural(iVar2);
  iVar2 = Gia_ManPoNum(pGroup);
  vCexes = (Vec_Ptr_t *)Vec_IntAlloc(iVar2);
  iVar2 = Gia_ManPoNum(pGroup);
  _k = Vec_PtrAlloc(iVar2);
  iVar2 = Gia_ManPoNum(pGroup);
  iVar2 = iVar2 / (int)pAbc._4_4_;
  iVar3 = Gia_ManPoNum(pGroup);
  iVar3 = iVar3 % (int)pAbc._4_4_;
  for (nGroupCur = 0; nGroupCur < (int)(iVar2 + (uint)(0 < iVar3)); nGroupCur = nGroupCur + 1) {
    iVar4 = (nGroupCur + 1) * pAbc._4_4_;
    iVar5 = Gia_ManPoNum(pGroup);
    if (iVar4 < iVar5) {
      local_94 = pAbc._4_4_;
    }
    else {
      iVar4 = Gia_ManPoNum(pGroup);
      local_94 = iVar4 - nGroupCur * pAbc._4_4_;
    }
    p_00 = pGroup;
    piVar8 = Vec_IntArray(vOutMap);
    vOuts = (Vec_Int_t *)Gia_ManDupCones(p_00,piVar8 + (int)(nGroupCur * pAbc._4_4_),local_94,0);
    Abc_Print(1,"GROUP %4d : %4d <= PoId < %4d : ",(ulong)(uint)nGroupCur,
              (ulong)(nGroupCur * pAbc._4_4_),(ulong)(nGroupCur * pAbc._4_4_ + local_94));
    Abc_FrameUpdateGia((Abc_Frame_t *)p,(Gia_Man_t *)vOuts);
    aVar9 = Abc_Clock();
    Cmd_CommandExecute((Abc_Frame_t *)p,_fVerbose_local);
    aVar10 = Abc_Clock();
    pVVar11 = vCexes;
    timeStart = (aVar10 - aVar9) + timeStart;
    if (pAbc._4_4_ == 1) {
      iVar4 = Abc_FrameReadProbStatus((Abc_Frame_t *)p);
      Vec_IntPush((Vec_Int_t *)pVVar11,iVar4);
      pVVar11 = _k;
      Entry = Abc_FrameReadCex((Abc_Frame_t *)p);
      Vec_PtrPush(pVVar11,Entry);
    }
    else {
      p_01 = Abc_FrameReadPoStatuses((Abc_Frame_t *)p);
      pVVar11 = Abc_FrameReadCexVec((Abc_Frame_t *)p);
      if (p_01 == (Vec_Int_t *)0x0) {
        __assert_fail("vStatusCur != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                      ,0x753,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
      }
      for (nGroups = 0; pVVar1 = vCexes, nGroups < (int)local_94; nGroups = nGroups + 1) {
        iVar4 = Vec_IntEntry(p_01,nGroups);
        Vec_IntPush((Vec_Int_t *)pVVar1,iVar4);
        pVVar1 = _k;
        if (pVVar11 == (Vec_Ptr_t *)0x0) {
          local_c8 = (void *)0x0;
        }
        else {
          local_c8 = Vec_PtrEntry(pVVar11,nGroups);
        }
        Vec_PtrPush(pVVar1,local_c8);
      }
    }
  }
  iVar2 = Vec_PtrSize(_k);
  iVar3 = Gia_ManPoNum(pGroup);
  if (iVar2 == iVar3) {
    iVar2 = Vec_IntSize((Vec_Int_t *)vCexes);
    iVar3 = Gia_ManPoNum(pGroup);
    if (iVar2 != iVar3) {
      __assert_fail("Vec_IntSize(vOutMap) == Gia_ManPoNum(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                    ,0x75d,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
    }
    iVar2 = Vec_PtrCountZero(_k);
    iVar3 = Vec_PtrSize(_k);
    if (iVar2 < iVar3) {
      Abc_FrameReplaceCexVec((Abc_Frame_t *)p,(Vec_Ptr_t **)&k);
    }
    else {
      Vec_PtrFree(_k);
    }
    Abc_Print(1,"SUMMARY:  ");
    uVar6 = Gia_ManPoNum(pGroup);
    Abc_Print(1,"Properties = %6d. ",(ulong)uVar6);
    uVar6 = Vec_IntCountEntry((Vec_Int_t *)vCexes,1);
    Abc_Print(1,"UNSAT = %6d. ",(ulong)uVar6);
    uVar6 = Vec_IntCountEntry((Vec_Int_t *)vCexes,0);
    Abc_Print(1,"SAT = %6d. ",(ulong)uVar6);
    uVar6 = Vec_IntCountEntry((Vec_Int_t *)vCexes,-1);
    Abc_Print(1,"UNDEC = %6d. ",(ulong)uVar6);
    Abc_Print(1,"\n");
    Abc_PrintTime(1,"Command time",timeStart);
    aVar9 = Abc_Clock();
    Abc_PrintTime(1,"Total time  ",aVar9 - aVar7);
    Vec_IntFree(vOutMap);
    Gia_ManStop(pGroup);
    return (Vec_Int_t *)vCexes;
  }
  __assert_fail("Vec_PtrSize(vCexes) == Gia_ManPoNum(p)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaUtil.c"
                ,0x75c,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
}

Assistant:

Vec_Int_t * Gia_ManGroupProve( Gia_Man_t * pInit, char * pCommLine, int nGroupSize, int fVerbose )
{
    Abc_Frame_t * pAbc = Abc_FrameReadGlobalFrame();
    Gia_Man_t * p = Gia_ManDup( pInit );
    Gia_Man_t * pGroup;
    Vec_Int_t * vOuts;
    Vec_Int_t * vOutMap;
    Vec_Ptr_t * vCexes;
    int i, k, nGroupCur, nGroups;
    abctime clk, timeComm = 0;
    abctime timeStart = Abc_Clock();
    // pre-conditions
    assert( nGroupSize > 0 );
    assert( pCommLine != NULL );
    assert( p->nConstrs == 0 );
    Abc_Print( 1, "RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n", nGroupSize, pCommLine );
    // create output map
    vOuts   = Vec_IntStartNatural( Gia_ManPoNum(p) );
    vOutMap = Vec_IntAlloc( Gia_ManPoNum(p) );
    vCexes  = Vec_PtrAlloc( Gia_ManPoNum(p) );
    nGroups = Gia_ManPoNum(p) / nGroupSize + (int)((Gia_ManPoNum(p) % nGroupSize) > 0);
    for ( i = 0; i < nGroups; i++ )
    {
        // derive the group
        nGroupCur = ((i + 1) * nGroupSize < Gia_ManPoNum(p)) ? nGroupSize : Gia_ManPoNum(p) - i * nGroupSize;
        pGroup = Gia_ManDupCones( p, Vec_IntArray(vOuts) + i * nGroupSize, nGroupCur, 0 );
        Abc_Print( 1, "GROUP %4d : %4d <= PoId < %4d : ", i, i * nGroupSize, i * nGroupSize + nGroupCur );
        // set the current GIA
        Abc_FrameUpdateGia( pAbc, pGroup );
        // solve the group
        clk = Abc_Clock();
        Cmd_CommandExecute( pAbc, pCommLine );
        timeComm += Abc_Clock() - clk;
        // get the solution status
        if ( nGroupSize == 1 )
        {
            Vec_IntPush( vOutMap, Abc_FrameReadProbStatus(pAbc) );
            Vec_PtrPush( vCexes, Abc_FrameReadCex(pAbc) );
        }
        else // if ( nGroupSize > 1 )  
        {
            Vec_Int_t * vStatusCur = Abc_FrameReadPoStatuses( pAbc );
            Vec_Ptr_t * vCexesCur = Abc_FrameReadCexVec( pAbc );
            assert( vStatusCur != NULL ); // only works for "bmc3" and "pdr"
//            assert( vCexesCur != NULL );
            for ( k = 0; k < nGroupCur; k++ )
            {
                Vec_IntPush( vOutMap, Vec_IntEntry(vStatusCur, k) );
                Vec_PtrPush( vCexes, vCexesCur ? Vec_PtrEntry(vCexesCur, k) : NULL );
            }
        }
    }
    assert( Vec_PtrSize(vCexes) == Gia_ManPoNum(p) );
    assert( Vec_IntSize(vOutMap) == Gia_ManPoNum(p) );
    // set CEXes
    if ( Vec_PtrCountZero(vCexes) < Vec_PtrSize(vCexes) )
        Abc_FrameReplaceCexVec( pAbc, &vCexes );
    else  // there is no CEXes
        Vec_PtrFree( vCexes );
    // report the result
    Abc_Print( 1, "SUMMARY:  " );
    Abc_Print( 1, "Properties = %6d. ", Gia_ManPoNum(p) );
    Abc_Print( 1, "UNSAT = %6d. ",      Vec_IntCountEntry(vOutMap, 1) );
    Abc_Print( 1, "SAT = %6d. ",        Vec_IntCountEntry(vOutMap, 0) );
    Abc_Print( 1, "UNDEC = %6d. ",      Vec_IntCountEntry(vOutMap, -1) );
    Abc_Print( 1, "\n" );
    Abc_PrintTime( 1, "Command time", timeComm );
    Abc_PrintTime( 1, "Total time  ", Abc_Clock() - timeStart );
    // cleanup
    Vec_IntFree( vOuts );
    Gia_ManStop( p );
    return vOutMap;
}